

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append
          (ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *this,SN_ELEMENT *x)

{
  undefined8 *puVar1;
  ON__UINT64 *pOVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  ON__UINT64 OVar6;
  SN_ELEMENT *pSVar7;
  undefined8 uVar8;
  ON__UINT64 OVar9;
  undefined8 uVar10;
  unsigned_short uVar11;
  unsigned_short uVar12;
  ON__UINT8 OVar13;
  ON__UINT8 OVar14;
  ON__UINT8 OVar15;
  ON__UINT8 OVar16;
  ON__UINT32 OVar17;
  ON__UINT32 OVar18;
  ON__UINT32 OVar19;
  SN_ELEMENT *memblock;
  long lVar20;
  int iVar21;
  uint uVar22;
  
  iVar3 = *(int *)(this + 0x10);
  memblock = x;
  if (iVar3 == *(int *)(this + 0x14)) {
    if ((iVar3 < 8) || ((ulong)((long)iVar3 * 0x38) < 0x10000001)) {
      uVar22 = 4;
      if (2 < iVar3) {
        uVar22 = iVar3 * 2;
      }
    }
    else {
      iVar21 = 0x49249a;
      if (iVar3 < 0x49249a) {
        iVar21 = iVar3;
      }
      uVar22 = iVar21 + iVar3;
    }
    if (x < *(SN_ELEMENT **)(this + 8) + *(int *)(this + 0x14) && *(SN_ELEMENT **)(this + 8) <= x) {
      memblock = (SN_ELEMENT *)onmalloc(0x38);
      uVar11 = (x->m_id).Data2;
      uVar12 = (x->m_id).Data3;
      uVar5 = *(undefined8 *)(x->m_id).Data4;
      OVar6 = x->m_sn;
      OVar13 = x->m_sn_active;
      OVar14 = x->m_id_active;
      OVar15 = x->m_reserved1;
      OVar16 = x->m_reserved2;
      OVar17 = x->m_id_crc32;
      pSVar7 = x->m_next;
      OVar18 = (x->m_value).m_u_type;
      OVar19 = (x->m_value).m_u32;
      (memblock->m_id).Data1 = (x->m_id).Data1;
      (memblock->m_id).Data2 = uVar11;
      (memblock->m_id).Data3 = uVar12;
      *(undefined8 *)(memblock->m_id).Data4 = uVar5;
      memblock->m_sn = OVar6;
      memblock->m_sn_active = OVar13;
      memblock->m_id_active = OVar14;
      memblock->m_reserved1 = OVar15;
      memblock->m_reserved2 = OVar16;
      memblock->m_id_crc32 = OVar17;
      memblock->m_next = pSVar7;
      (memblock->m_value).m_u_type = OVar18;
      (memblock->m_value).m_u32 = OVar19;
      (memblock->m_value).m_u = (x->m_value).m_u;
    }
    if (*(uint *)(this + 0x14) < uVar22) {
      SetCapacity(this,(long)(int)uVar22);
    }
    if (*(long *)(this + 8) == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  lVar4 = *(long *)(this + 8);
  iVar3 = *(int *)(this + 0x10);
  *(int *)(this + 0x10) = iVar3 + 1;
  lVar20 = (long)iVar3 * 0x38;
  *(anon_union_8_5_72d3814f_for_m_u *)(lVar4 + 0x30 + lVar20) = (memblock->m_value).m_u;
  uVar5 = *(undefined8 *)&memblock->m_id;
  uVar8 = *(undefined8 *)(memblock->m_id).Data4;
  OVar6 = memblock->m_sn;
  OVar9 = *(ON__UINT64 *)&memblock->m_sn_active;
  uVar10 = *(undefined8 *)&memblock->m_value;
  puVar1 = (undefined8 *)(lVar4 + 0x20 + lVar20);
  *puVar1 = memblock->m_next;
  puVar1[1] = uVar10;
  pOVar2 = (ON__UINT64 *)(lVar4 + 0x10 + lVar20);
  *pOVar2 = OVar6;
  pOVar2[1] = OVar9;
  *(undefined8 *)(lVar4 + lVar20) = uVar5;
  ((undefined8 *)(lVar4 + lVar20))[1] = uVar8;
  if (memblock != x) {
    onfree(memblock);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}